

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O3

bool duckdb_snappy::RawUncompressToIOVec(Source *compressed,iovec *iov,size_t iov_cnt)

{
  bool bVar1;
  SnappyIOVecWriter output;
  SnappyDecompressor decompressor;
  uint32_t local_6c;
  SnappyIOVecWriter local_68;
  SnappyDecompressor local_38;
  
  local_68.output_iov_end_ = iov + iov_cnt;
  if (iov_cnt == 0) {
    local_68.curr_iov_output_ = (char *)0x0;
    local_68.curr_iov_remaining_ = 0;
  }
  else {
    local_68.curr_iov_output_ = (char *)iov->iov_base;
    local_68.curr_iov_remaining_ = iov->iov_len;
  }
  local_68.total_written_ = 0;
  local_68.output_limit_ = 0xffffffffffffffff;
  local_38.peeked_ = 0;
  local_38.eof_ = false;
  local_38.ip_ = (char *)0x0;
  local_38.ip_limit_ = (char *)0x0;
  local_6c = 0;
  local_68.curr_iov_ = iov;
  local_38.reader_ = compressed;
  bVar1 = SnappyDecompressor::ReadUncompressedLength(&local_38,&local_6c);
  if (bVar1) {
    (*compressed->_vptr_Source[2])(compressed);
    local_68.output_limit_ = (size_t)local_6c;
    SnappyDecompressor::DecompressAllTags<duckdb_snappy::SnappyIOVecWriter>(&local_38,&local_68);
    if (local_38.eof_ == true) {
      bVar1 = local_68.total_written_ == local_68.output_limit_;
      goto LAB_01cf8fa4;
    }
  }
  bVar1 = false;
LAB_01cf8fa4:
  (*(local_38.reader_)->_vptr_Source[4])(local_38.reader_,(ulong)local_38.peeked_);
  return bVar1;
}

Assistant:

bool RawUncompressToIOVec(Source* compressed, const struct iovec* iov,
                          size_t iov_cnt) {
  SnappyIOVecWriter output(iov, iov_cnt);
  return InternalUncompress(compressed, &output);
}